

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int get_cpu_support_x86_avx512_vnni(void)

{
  uint uVar1;
  int nIds;
  uint cpu_info [4];
  uint *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  uint local_18 [2];
  uint local_10;
  uint local_4;
  
  memset(local_18,0,0x10);
  x86_cpuid(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  if ((int)local_18[0] < 7) {
    local_4 = 0;
  }
  else {
    x86_cpuid(local_18[0],in_stack_ffffffffffffffd8);
    if ((((local_10 & 0x10000000) == 0) || ((local_10 & 0x4000000) == 0)) ||
       ((local_10 & 0x8000000) == 0)) {
      local_4 = 0;
    }
    else {
      uVar1 = x86_get_xcr0();
      if ((uVar1 & 6) == 6) {
        uVar1 = x86_get_xcr0();
        if ((uVar1 & 0xe0) == 0xe0) {
          x86_cpuid_sublevel(7,0,local_18);
          local_4 = local_10 & 0x800;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int get_cpu_support_x86_avx512_vnni()
{
#if !NCNN_AVX512VNNI
    return 0;
#endif
    unsigned int cpu_info[4] = {0};
    x86_cpuid(0, cpu_info);

    int nIds = cpu_info[0];
    if (nIds < 7)
        return 0;

    x86_cpuid(1, cpu_info);
    // check AVX XSAVE OSXSAVE
    if (!(cpu_info[2] & (1u << 28)) || !(cpu_info[2] & (1u << 26)) || !(cpu_info[2] & (1u << 27)))
        return 0;

    // check XSAVE enabled by kernel
    if ((x86_get_xcr0() & 6) != 6)
        return 0;

    // check avx512 XSAVE enabled by kernel
    if ((x86_get_xcr0() & 0xe0) != 0xe0)
        return 0;

    x86_cpuid_sublevel(7, 0, cpu_info);
    return cpu_info[2] & (1u << 11);
}